

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaXPathEvaluate(xmlSchemaValidCtxtPtr vctxt,xmlElementType nodeType)

{
  xmlSchemaIDCStateObjPtr_conflict pxVar1;
  int iVar2;
  int *piVar3;
  xmlSchemaIDCSelectPtr_conflict local_50;
  xmlSchemaIDCSelectPtr_conflict sel;
  int local_40;
  int depth;
  int resolved;
  int res;
  xmlSchemaIDCStateObjPtr_conflict first;
  xmlSchemaIDCStateObjPtr_conflict head;
  xmlSchemaIDCStateObjPtr_conflict sto;
  xmlElementType nodeType_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  first = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  local_40 = 0;
  sel._4_4_ = vctxt->depth;
  if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    vctxt_local._4_4_ = 0;
  }
  else {
    if (nodeType == XML_ATTRIBUTE_NODE) {
      sel._4_4_ = sel._4_4_ + 1;
    }
    pxVar1 = vctxt->xpathStates;
    head = pxVar1;
    while (head != first) {
      if (nodeType == XML_ELEMENT_NODE) {
        depth = xmlStreamPush((xmlStreamCtxtPtr)head->xpathCtxt,vctxt->inode->localName,
                              vctxt->inode->nsName);
      }
      else {
        depth = xmlStreamPushAttr((xmlStreamCtxtPtr)head->xpathCtxt,vctxt->inode->localName,
                                  vctxt->inode->nsName);
      }
      if (depth == -1) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathEvaluate",
                   "calling xmlStreamPush()");
        return -1;
      }
      if (depth != 0) {
        if (head->history == (int *)0x0) {
          piVar3 = (int *)(*xmlMalloc)(0x14);
          head->history = piVar3;
          if (head->history == (int *)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating the state object history",
                                (xmlNodePtr)0x0);
            return -1;
          }
          head->sizeHistory = 5;
        }
        else if (head->sizeHistory <= head->nbHistory) {
          head->sizeHistory = head->sizeHistory << 1;
          piVar3 = (int *)(*xmlRealloc)(head->history,(long)head->sizeHistory << 2);
          head->history = piVar3;
          if (head->history == (int *)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"re-allocating the state object history",
                                (xmlNodePtr)0x0);
            return -1;
          }
        }
        iVar2 = head->nbHistory;
        head->nbHistory = iVar2 + 1;
        head->history[iVar2] = sel._4_4_;
        if (head->type == 1) {
          for (local_50 = head->matcher->aidc->def->fields;
              local_50 != (xmlSchemaIDCSelectPtr_conflict)0x0; local_50 = local_50->next) {
            iVar2 = xmlSchemaIDCAddStateObject(vctxt,head->matcher,local_50,2);
            if (iVar2 == -1) {
              return -1;
            }
          }
        }
        else if (head->type == 2) {
          if ((local_40 == 0) && ((vctxt->inode->flags & 0x10U) == 0)) {
            vctxt->inode->flags = vctxt->inode->flags | 0x10;
          }
          local_40 = local_40 + 1;
        }
      }
      if (head->next == (xmlSchemaIDCStateObjPtr)0x0) {
        head = vctxt->xpathStates;
        first = pxVar1;
      }
      else {
        head = head->next;
      }
    }
    vctxt_local._4_4_ = local_40;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaXPathEvaluate(xmlSchemaValidCtxtPtr vctxt,
		       xmlElementType nodeType)
{
    xmlSchemaIDCStateObjPtr sto, head = NULL, first;
    int res, resolved = 0, depth = vctxt->depth;

    if (vctxt->xpathStates == NULL)
	return (0);

    if (nodeType == XML_ATTRIBUTE_NODE)
	depth++;
#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: EVAL on %s, depth %d, type %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), depth, nodeType);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Process all active XPath state objects.
    */
    first = vctxt->xpathStates;
    sto = first;
    while (sto != head) {
#ifdef DEBUG_IDC
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR)
	    xmlGenericError(xmlGenericErrorContext, "IDC:   ['%s'] selector '%s'\n",
		sto->matcher->aidc->def->name, sto->sel->xpath);
	else
	    xmlGenericError(xmlGenericErrorContext, "IDC:   ['%s'] field '%s'\n",
		sto->matcher->aidc->def->name, sto->sel->xpath);
#endif
	if (nodeType == XML_ELEMENT_NODE)
	    res = xmlStreamPush((xmlStreamCtxtPtr) sto->xpathCtxt,
		vctxt->inode->localName, vctxt->inode->nsName);
	else
	    res = xmlStreamPushAttr((xmlStreamCtxtPtr) sto->xpathCtxt,
		vctxt->inode->localName, vctxt->inode->nsName);

	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathEvaluate",
		"calling xmlStreamPush()");
	    return (-1);
	}
	if (res == 0)
	    goto next_sto;
	/*
	* Full match.
	*/
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:     "
	    "MATCH\n");
#endif
	/*
	* Register a match in the state object history.
	*/
	if (sto->history == NULL) {
	    sto->history = (int *) xmlMalloc(5 * sizeof(int));
	    if (sto->history == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating the state object history", NULL);
		return(-1);
	    }
	    sto->sizeHistory = 5;
	} else if (sto->sizeHistory <= sto->nbHistory) {
	    sto->sizeHistory *= 2;
	    sto->history = (int *) xmlRealloc(sto->history,
		sto->sizeHistory * sizeof(int));
	    if (sto->history == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "re-allocating the state object history", NULL);
		return(-1);
	    }
	}
	sto->history[sto->nbHistory++] = depth;

#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:       push match '%d'\n",
	    vctxt->depth);
#endif

	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {
	    xmlSchemaIDCSelectPtr sel;
	    /*
	    * Activate state objects for the IDC fields of
	    * the IDC selector.
	    */
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:     "
		"activating field states\n");
#endif
	    sel = sto->matcher->aidc->def->fields;
	    while (sel != NULL) {
		if (xmlSchemaIDCAddStateObject(vctxt, sto->matcher,
		    sel, XPATH_STATE_OBJ_TYPE_IDC_FIELD) == -1)
		    return (-1);
		sel = sel->next;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * An IDC key node was found by the IDC field.
	    */
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext,
		"IDC:     key found\n");
#endif
	    /*
	    * Notify that the character value of this node is
	    * needed.
	    */
	    if (resolved == 0) {
		if ((vctxt->inode->flags &
		    XML_SCHEMA_NODE_INFO_VALUE_NEEDED) == 0)
		vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_VALUE_NEEDED;
	    }
	    resolved++;
	}
next_sto:
	if (sto->next == NULL) {
	    /*
	    * Evaluate field state objects created on this node as well.
	    */
	    head = first;
	    sto = vctxt->xpathStates;
	} else
	    sto = sto->next;
    }
    return (resolved);
}